

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_map_based.cpp
# Opt level: O3

void __thiscall
so_5::impl::map_based_subscr_storage::storage_t::setup_content
          (storage_t *this,subscr_info_vector_t *info)

{
  atomic_refcounted_t *paVar1;
  event_handler_data_t *this_00;
  event_handler_data_t *peVar2;
  pointer psVar3;
  int iVar4;
  undefined4 extraout_var;
  iterator iVar5;
  const_iterator __position;
  pointer psVar6;
  subscr_map_t events;
  value_t local_f0;
  key_t local_c0;
  pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>
  local_a8;
  _Rb_tree<so_5::impl::map_based_subscr_storage::storage_t::key_t,_std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>,_std::_Select1st<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>,_std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,_std::allocator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>_>
  local_60;
  
  __position._M_node = &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  psVar6 = (info->
           super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (info->
           super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = __position._M_node;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = __position._M_node;
  if (psVar6 != psVar3) {
    this_00 = &local_f0.m_handler;
    do {
      iVar4 = (*((psVar6->m_mbox).m_obj)->_vptr_abstract_message_box_t[2])();
      local_c0.m_mbox_id = CONCAT44(extraout_var,iVar4);
      local_c0.m_msg_type._M_target = (psVar6->m_msg_type)._M_target;
      local_c0.m_state = psVar6->m_state;
      local_f0.m_mbox.m_obj = (psVar6->m_mbox).m_obj;
      if (local_f0.m_mbox.m_obj != (abstract_message_box_t *)0x0) {
        LOCK();
        ((local_f0.m_mbox.m_obj)->super_atomic_refcounted_t).m_ref_counter.
        super___atomic_base<unsigned_long>._M_i =
             ((local_f0.m_mbox.m_obj)->super_atomic_refcounted_t).m_ref_counter.
             super___atomic_base<unsigned_long>._M_i + 1;
        UNLOCK();
      }
      std::function<void_(so_5::invocation_type_t,_so_5::intrusive_ptr_t<so_5::message_t>_&)>::
      function(&this_00->m_method,&(psVar6->m_handler).m_method);
      local_f0.m_handler.m_thread_safety = (psVar6->m_handler).m_thread_safety;
      std::
      pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>
      ::
      pair<so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t,_true>
                (&local_a8,&local_c0,&local_f0);
      if (local_f0.m_handler.m_method.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_f0.m_handler.m_method.super__Function_base._M_manager)
                  ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
      }
      if (local_f0.m_mbox.m_obj != (abstract_message_box_t *)0x0) {
        LOCK();
        paVar1 = &(local_f0.m_mbox.m_obj)->super_atomic_refcounted_t;
        (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
             (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
        UNLOCK();
        if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
           (local_f0.m_mbox.m_obj != (abstract_message_box_t *)0x0)) {
          (*(local_f0.m_mbox.m_obj)->_vptr_abstract_message_box_t[1])();
        }
      }
      local_f0.m_mbox.m_obj = (abstract_message_box_t *)&local_60;
      iVar5 = std::
              _Rb_tree<so_5::impl::map_based_subscr_storage::storage_t::key_t,std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>,std::_Select1st<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>,std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,std::allocator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>
              ::
              _M_insert_unique_<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>,std::_Rb_tree<so_5::impl::map_based_subscr_storage::storage_t::key_t,std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>,std::_Select1st<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>,std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,std::allocator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>::_Alloc_node>
                        ((_Rb_tree<so_5::impl::map_based_subscr_storage::storage_t::key_t,std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>,std::_Select1st<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>,std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,std::allocator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>
                          *)&local_60,__position,&local_a8,(_Alloc_node *)&local_f0);
      __position._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar5._M_node);
      if (local_a8.second.m_handler.m_method.super__Function_base._M_manager != (_Manager_type)0x0)
      {
        peVar2 = &local_a8.second.m_handler;
        (*local_a8.second.m_handler.m_method.super__Function_base._M_manager)
                  ((_Any_data *)peVar2,(_Any_data *)peVar2,__destroy_functor);
      }
      if (local_a8.second.m_mbox.m_obj != (abstract_message_box_t *)0x0) {
        LOCK();
        paVar1 = &(local_a8.second.m_mbox.m_obj)->super_atomic_refcounted_t;
        (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
             (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
        UNLOCK();
        if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
           (local_a8.second.m_mbox.m_obj != (abstract_message_box_t *)0x0)) {
          (*(local_a8.second.m_mbox.m_obj)->_vptr_abstract_message_box_t[1])();
        }
      }
      psVar6 = psVar6 + 1;
    } while (psVar6 != psVar3);
  }
  std::
  _Rb_tree<so_5::impl::map_based_subscr_storage::storage_t::key_t,_std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>,_std::_Select1st<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>,_std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,_std::allocator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>_>
  ::swap(&(this->m_events)._M_t,&local_60);
  std::
  _Rb_tree<so_5::impl::map_based_subscr_storage::storage_t::key_t,_std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>,_std::_Select1st<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>,_std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,_std::allocator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void
storage_t::setup_content(
	subscription_storage_common::subscr_info_vector_t && info )
	{
		using namespace std;
		using namespace subscription_storage_common;

		subscr_map_t events;
		transform( begin(info), end(info),
				inserter( events, events.begin() ),
				[]( const subscr_info_t & i )
				{
					return subscr_map_t::value_type {
							key_t {
								i.m_mbox->id(),
								i.m_msg_type,
								i.m_state
							},
							value_t {
								i.m_mbox,
								i.m_handler
							} };
				} );

		m_events.swap( events );
	}